

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  mtree *mtree;
  __mode_t p;
  wchar_t wVar4;
  wchar_t wVar5;
  mode_t mVar6;
  int iVar7;
  mtree_entry *pmVar8;
  int *piVar9;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar10;
  archive_string *paVar11;
  ushort **ppuVar12;
  size_t sVar13;
  mtree_entry **ppmVar14;
  archive_rb_node *paVar15;
  archive_rb_node *paVar16;
  size_t len;
  mtree_entry *pmVar17;
  la_int64_t lVar18;
  char *pcVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  size_t sVar25;
  __dev_t _Var26;
  mtree_entry *pmVar27;
  mtree_entry *pmVar28;
  archive_rb_tree *rbt;
  char *pcVar29;
  mtree_option *pmVar30;
  long lVar31;
  uint uVar32;
  mtree_entry *local_130;
  wchar_t local_11c;
  mtree_option *global;
  mtree_entry *local_110;
  mtree_entry *local_108;
  mtree_entry *local_100;
  archive_rb_tree *local_f8;
  ulong local_f0;
  mtree_entry *local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *sparse_entry;
  mtree_entry **local_c8;
  stat_conflict st_storage;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return L'\xffffffe2';
    }
    local_c8 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(wchar_t *)&sparse_entry);
    local_d8 = &mtree->rbtree;
    local_110 = (mtree_entry *)0x0;
    local_f8 = (archive_rb_tree *)0x1;
LAB_0014696b:
    lVar31 = 0;
    local_130 = (mtree_entry *)0x0;
    while (__s = __archive_read_ahead(a,1,(ssize_t *)&st_storage), _Var26 = st_storage.st_dev,
          __s != (void *)0x0) {
      if ((long)st_storage.st_dev < 0) goto LAB_00147143;
      pvVar10 = memchr(__s,10,st_storage.st_dev);
      if (pvVar10 != (void *)0x0) {
        _Var26 = (long)pvVar10 + (1 - (long)__s);
        st_storage.st_dev = _Var26;
      }
      if (0xffff < (long)(_Var26 + (long)local_130)) {
        pcVar19 = "Line too long";
        iVar7 = 0x54;
        goto LAB_0014711f;
      }
      paVar11 = archive_string_ensure((archive_string *)mtree,_Var26 + (long)local_130 + 1);
      if (paVar11 == (archive_string *)0x0) {
        pcVar19 = "Can\'t allocate working buffer";
        iVar7 = 0xc;
        goto LAB_0014711f;
      }
      memcpy((mtree->line).s + (long)local_130,__s,st_storage.st_dev);
      __archive_read_consume(a,st_storage.st_dev);
      lVar20 = st_storage.st_dev + (long)local_130;
      (mtree->line).s[lVar20] = '\0';
      pmVar8 = (mtree_entry *)(mtree->line).s;
      pcVar19 = (char *)((long)(pmVar8->rbnode).rb_nodes + lVar31);
LAB_00146a2d:
      cVar1 = *pcVar19;
      if (cVar1 == '#') {
        if (pvVar10 == (void *)0x0) goto LAB_00146a6f;
LAB_00146a5e:
        pcVar19 = pcVar19 + 1;
        goto LAB_00146a2d;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '\0') goto LAB_00146a6f;
        if (cVar1 == '\n') {
          if (lVar20 == 0) break;
          if (lVar20 < 0) {
            wVar4 = (wchar_t)lVar20;
            goto LAB_00147147;
          }
          lVar31 = 0;
          pmVar27 = pmVar8;
          goto LAB_00146a9c;
        }
        goto LAB_00146a5e;
      }
      if (pcVar19[1] == '\0') goto LAB_00146a5e;
      if (pcVar19[1] != '\n') {
        pcVar19 = pcVar19 + 1;
        goto LAB_00146a5e;
      }
      *(char *)((long)(pmVar8->rbnode).rb_nodes + lVar20 + -2) = '\0';
      lVar20 = lVar20 + -2;
      pmVar8 = (mtree_entry *)(mtree->line).s;
LAB_00146a6f:
      lVar31 = (long)pcVar19 - (long)pmVar8;
      local_130 = (mtree_entry *)lVar20;
    }
    mtree->this_entry = mtree->entries;
    wVar4 = L'\0';
    goto LAB_00147147;
  }
  goto LAB_00146559;
LAB_00146a9c:
  pmVar27 = (mtree_entry *)((long)(pmVar27->rbnode).rb_nodes + 1);
  bVar2 = *(byte *)((long)(pmVar8->rbnode).rb_nodes + lVar31);
  uVar22 = (ulong)bVar2;
  if (0x23 < uVar22) goto LAB_00146acf;
  if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar22 & 0x3f) & 1) != 0) goto LAB_00146ac5;
    goto LAB_00146acf;
  }
  lVar31 = lVar31 + 1;
  goto LAB_00146a9c;
LAB_00146acf:
  pmVar28 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + lVar31);
  local_f0 = (st_storage.st_dev + (long)local_130) - lVar31;
  local_130 = (mtree_entry *)((long)pmVar28 + (local_f0 - 1));
  local_108 = pmVar8;
  local_100 = pmVar28;
  while (iVar7 = (int)sparse_entry, pmVar28 < local_130) {
    ppuVar12 = __ctype_b_loc();
    bVar3 = *(byte *)(pmVar28->rbnode).rb_nodes;
    pmVar28 = (mtree_entry *)((long)(pmVar28->rbnode).rb_nodes + 1);
    if ((bVar3 != 9) && (((*ppuVar12)[bVar3] & 0x4000) == 0)) goto LAB_00147128;
  }
  if (bVar2 == 0x2f) {
    if (4 < (long)local_f0) {
      iVar7 = strncmp((char *)local_100,"/set",4);
      if (iVar7 == 0) {
        cVar1 = *(char *)((long)(local_108->rbnode).rb_nodes + lVar31 + 4);
        if ((cVar1 == ' ') || (cVar1 == '\t')) {
          pcVar19 = (char *)((long)(local_108->rbnode).rb_nodes + lVar31 + 4);
          while (sVar13 = strspn(pcVar19," \t\r\n"), pcVar19[sVar13] != '\0') {
            pcVar29 = pcVar19 + sVar13;
            sVar13 = strcspn(pcVar29," \t\r\n");
            pcVar19 = pcVar29 + sVar13;
            pcVar24 = strchr(pcVar29,0x3d);
            sVar25 = (long)pcVar24 - (long)pcVar29;
            if (pcVar19 < pcVar24) {
              sVar25 = sVar13;
            }
            remove_option(&global,pcVar29,sVar25);
            wVar4 = add_option(a,&global,pcVar29,sVar13);
            if (wVar4 != L'\0') goto LAB_00147147;
          }
LAB_00146ac5:
          local_f8 = (archive_rb_tree *)((long)local_f8 + 1);
          goto LAB_0014696b;
        }
      }
      else if (((6 < local_f0) && (iVar7 = strncmp((char *)local_100,"/unset",6), iVar7 == 0)) &&
              ((cVar1 = *(char *)((long)(local_108->rbnode).rb_nodes + lVar31 + 6), cVar1 == ' ' ||
               (cVar1 == '\t')))) {
        pcVar24 = (char *)((long)(local_108->rbnode).rb_nodes + lVar31 + 6);
        pcVar19 = strchr(pcVar24,0x3d);
        if (pcVar19 == (char *)0x0) {
          while( true ) {
            sVar13 = strspn(pcVar24," \t\r\n");
            cVar1 = pcVar24[sVar13];
            if (cVar1 == '\0') break;
            pcVar24 = pcVar24 + sVar13;
            sVar13 = strcspn(pcVar24," \t\r\n");
            if (((cVar1 == 'a' && sVar13 == 3) && (pcVar24[1] == 'l')) && (pcVar24[2] == 'l')) {
              free_options(global);
              global = (mtree_option *)0x0;
            }
            else {
              remove_option(&global,pcVar24,sVar13);
            }
            pcVar24 = pcVar24 + sVar13;
          }
          goto LAB_00146ac5;
        }
        pcVar19 = "/unset shall not contain `=\'";
        iVar7 = -1;
        goto LAB_0014711f;
      }
    }
LAB_00147128:
    archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_f8);
  }
  else {
    local_e8 = (mtree_entry *)malloc(0x40);
    pmVar28 = local_100;
    pmVar8 = local_108;
    if (local_e8 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e8->options + 2) = 0;
      *(undefined8 *)((long)&local_e8->name + 2) = 0;
      local_e8->next = (mtree_entry *)0x0;
      local_e8->options = (mtree_option *)0x0;
      ppmVar14 = &local_110->next;
      if (local_110 == (mtree_entry *)0x0) {
        ppmVar14 = local_c8;
      }
      *ppmVar14 = local_e8;
      local_e0 = local_e8;
      if (iVar7 == 0) {
        pcVar19 = (char *)strcspn((char *)local_100," \t\r\n");
        pmVar8 = (mtree_entry *)(pcVar19 + (long)((long)(pmVar8->rbnode).rb_nodes + lVar31));
        local_110 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + local_f0);
      }
      else {
        uVar22 = local_f0;
        while (((uVar23 = (long)local_f0 >> 0x3f & local_f0, 0 < (long)uVar22 &&
                (uVar21 = (ulong)*(byte *)(local_130->rbnode).rb_nodes, uVar23 = uVar22,
                uVar21 < 0x21)) && ((0x100002600U >> (uVar21 & 0x3f) & 1) != 0))) {
          uVar22 = uVar22 - 1;
          local_130 = (mtree_entry *)&local_130[-1].field_0x3f;
        }
        uVar22 = 0;
        if (0 < (long)uVar23) {
          uVar22 = uVar23;
        }
        while (uVar22 != 0) {
          if (((ulong)(byte)pmVar27[-1].field_0x3f < 0x21) &&
             ((0x100002600U >> ((ulong)(byte)pmVar27[-1].field_0x3f & 0x3f) & 1) != 0)) {
            pmVar28 = pmVar27;
          }
          pmVar27 = (mtree_entry *)((long)(pmVar27->rbnode).rb_nodes + 1);
          uVar22 = uVar22 - 1;
        }
        pcVar19 = (char *)((long)local_108 + lVar31 + (uVar23 - (long)pmVar28));
        pmVar8 = local_100;
        local_110 = pmVar28;
      }
      pcVar24 = (char *)malloc((size_t)(pcVar19 + 1));
      pmVar27 = local_e0;
      local_e0->name = pcVar24;
      if (pcVar24 != (char *)0x0) {
        memcpy(pcVar24,pmVar28,(size_t)pcVar19);
        pcVar24[(long)pcVar19] = '\0';
        parse_escapes(pcVar24,pmVar27);
        pmVar28 = local_e8;
        pmVar27->next_dup = (mtree_entry *)0x0;
        if (((pmVar27->full != '\0') &&
            (iVar7 = __archive_rb_tree_insert_node(local_d8,&pmVar27->rbnode), iVar7 == 0)) &&
           (paVar15 = __archive_rb_tree_find_node(local_d8,pmVar27->name),
           paVar15 != (archive_rb_node *)0x0)) {
          do {
            paVar16 = paVar15;
            paVar15 = paVar16[1].rb_nodes[0];
          } while (paVar15 != (archive_rb_node *)0x0);
          paVar16[1].rb_nodes[0] = &pmVar27->rbnode;
        }
        pmVar30 = (mtree_option *)&global;
        while (pmVar30 = pmVar30->next, pmVar27 = (mtree_entry *)&pmVar28->options,
              pmVar30 != (mtree_option *)0x0) {
          pcVar19 = pmVar30->value;
          sVar13 = strlen(pcVar19);
          wVar4 = add_option(a,&pmVar28->options,pcVar19,sVar13);
          if (wVar4 != L'\0') goto LAB_00147147;
        }
        while ((local_e8 = pmVar27, sVar13 = strspn((char *)pmVar8," \t\r\n"),
               *(char *)((long)(pmVar8->rbnode).rb_nodes + sVar13) != '\0' &&
               (pmVar27 = (mtree_entry *)((long)(pmVar8->rbnode).rb_nodes + sVar13),
               pmVar27 < local_110))) {
          len = strcspn((char *)pmVar27," \t\r\n");
          pmVar8 = (mtree_entry *)((long)(pmVar27->rbnode).rb_nodes + len);
          pmVar17 = (mtree_entry *)strchr((char *)pmVar27,0x3d);
          pmVar28 = local_e8;
          sVar13 = (long)pmVar17 - (long)pmVar27;
          if (pmVar8 < pmVar17) {
            sVar13 = len;
          }
          if (pmVar17 == (mtree_entry *)0x0) {
            sVar13 = len;
          }
          remove_option((mtree_option **)local_e8,(char *)pmVar27,sVar13);
          wVar4 = add_option(a,(mtree_option **)pmVar28,(char *)pmVar27,len);
          pmVar27 = local_e8;
          if (wVar4 != L'\0') goto LAB_00147147;
        }
        local_110 = local_e0;
        goto LAB_00146ac5;
      }
    }
    piVar9 = __errno_location();
    iVar7 = *piVar9;
    pcVar19 = "Can\'t allocate memory";
LAB_0014711f:
    archive_set_error(&a->archive,iVar7,pcVar19);
  }
LAB_00147143:
  wVar4 = L'\xffffffe2';
LAB_00147147:
  free_options(global);
  if (wVar4 != L'\0') {
    return wVar4;
  }
LAB_00146559:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  paVar11 = &mtree->current_dir;
  rbt = &mtree->rbtree;
  pmVar8 = mtree->this_entry;
  local_f8 = rbt;
  do {
    if (pmVar8 == (mtree_entry *)0x0) {
      return L'\x01';
    }
    pcVar19 = pmVar8->name;
    if (((*pcVar19 == '.') && (pcVar19[1] == '.')) && (pcVar19[2] == '\0')) {
      pmVar8->used = '\x01';
      sVar25 = (mtree->current_dir).length;
      if (sVar25 != 0) {
        pcVar19 = paVar11->s;
        pcVar24 = pcVar19 + sVar25;
        do {
          pcVar29 = pcVar24;
          pcVar24 = pcVar29 + -1;
          if (pcVar24 < pcVar19) break;
        } while (*pcVar24 != '/');
        pcVar29 = pcVar29 + -2;
        if (pcVar24 < pcVar19) {
          pcVar29 = pcVar24;
        }
        (mtree->current_dir).length = (size_t)(pcVar29 + (1 - (long)pcVar19));
      }
    }
    else if (pmVar8->used == '\0') {
      pmVar8->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_11c = L'\0';
      wVar4 = parse_line(a,entry,mtree,pmVar8,&local_11c);
      if (pmVar8->full == '\0') {
        sVar25 = (mtree->current_dir).length;
        if (sVar25 != 0) {
          archive_strcat(paVar11,"/");
        }
        archive_strcat(paVar11,pmVar8->name);
        archive_entry_copy_pathname(entry,paVar11->s);
        mVar6 = archive_entry_filetype(entry);
        rbt = local_f8;
        if (mVar6 != 0x4000) {
          (mtree->current_dir).length = sVar25;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar8->name);
        for (pmVar8 = (mtree_entry *)__archive_rb_tree_find_node(rbt,pmVar8->name);
            pmVar8 != (mtree_entry *)0x0; pmVar8 = pmVar8->next_dup) {
          if ((pmVar8->full != '\0') && (pmVar8->used == '\0')) {
            pmVar8->used = '\x01';
            wVar5 = parse_line(a,entry,mtree,pmVar8,&local_11c);
            if (wVar5 < wVar4) {
              wVar4 = wVar5;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_001470b5;
      mtree->fd = L'\xffffffff';
      if ((mtree->contents_name).length == 0) {
        pcVar19 = archive_entry_pathname(entry);
      }
      else {
        pcVar19 = (mtree->contents_name).s;
      }
      mVar6 = archive_entry_filetype(entry);
      if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
        wVar5 = open(pcVar19,0x80000);
        mtree->fd = wVar5;
        __archive_ensure_cloexec_flag(wVar5);
        wVar5 = mtree->fd;
        if (wVar5 == L'\xffffffff') {
          piVar9 = __errno_location();
          if ((*piVar9 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar9,"Can\'t open %s",pcVar19);
            wVar4 = L'\xffffffec';
          }
          goto LAB_0014673d;
        }
      }
      else {
LAB_0014673d:
        wVar5 = mtree->fd;
      }
      if (wVar5 < L'\0') {
        iVar7 = lstat(pcVar19,(stat *)&st_storage);
        if (iVar7 == -1) goto LAB_001467cd;
LAB_00146791:
        p = st_storage.st_mode;
        uVar32 = st_storage.st_mode & 0xf000;
        if (uVar32 == 0xa000) {
          mVar6 = archive_entry_filetype(entry);
          if (mVar6 != 0xa000) goto LAB_0014683c;
        }
        else if ((uVar32 != 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0x8000)) {
LAB_0014683c:
          if (((~p & 0xc000) != 0) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0xc000)) {
            switch(uVar32 - 0x1000 >> 0xc) {
            case 0:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x1000) goto LAB_00146f7d;
              break;
            case 1:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x2000) goto LAB_00146f7d;
              break;
            case 3:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x4000) goto LAB_00146f7d;
              break;
            case 5:
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 == 0x6000) goto LAB_00146f7d;
            }
            if (L'\xffffffff' < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = L'\xffffffff';
            if ((local_11c & 0x800U) == 0) {
              if (wVar4 != L'\0') {
                return wVar4;
              }
              pcVar19 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar19);
              return L'\xffffffec';
            }
            goto LAB_001468ea;
          }
        }
LAB_00146f7d:
        wVar5 = local_11c;
        if (((local_11c & 0x1001U) != 1) &&
           ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
            (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((wVar5 & 0xcU) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((wVar5 & 0x600U) == 0 || ((uint)wVar5 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((wVar5 & 0x1010U) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((wVar5 & 0x1020U) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((wVar5 & 0x1040U) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((wVar5 & 0x1080U) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_001470b5:
        lVar18 = archive_entry_size(entry);
        mtree->cur_size = lVar18;
        mtree->offset = 0;
        return wVar4;
      }
      iVar7 = fstat(wVar5,(stat *)&st_storage);
      if (iVar7 != -1) goto LAB_00146791;
      piVar9 = __errno_location();
      archive_set_error(&a->archive,*piVar9,"Could not fstat %s",pcVar19);
      close(mtree->fd);
      mtree->fd = L'\xffffffff';
      wVar4 = L'\xffffffec';
LAB_001467cd:
      if ((local_11c & 0x800U) == 0) goto LAB_001470b5;
LAB_001468ea:
      pmVar8 = mtree->this_entry;
    }
    pmVar8 = pmVar8->next;
    mtree->this_entry = pmVar8;
  } while( true );
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}